

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

string * __thiscall
t_dart_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_type *ttype)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  long lVar3;
  string *psVar4;
  int iVar5;
  t_base_type *type;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  undefined8 *puVar9;
  ulong *puVar10;
  size_type *psVar11;
  t_dart_generator *this_00;
  undefined8 uVar12;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  string local_a8;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  this_00 = this;
  type = (t_base_type *)t_type::get_true_type(ttype);
  iVar5 = (*(type->super_t_type).super_t_doc._vptr_t_doc[5])(type);
  if ((char)iVar5 != '\0') {
    base_type_name_abi_cxx11_(__return_storage_ptr__,this_00,type);
    return __return_storage_ptr__;
  }
  iVar5 = (*(type->super_t_type).super_t_doc._vptr_t_doc[10])(type);
  if ((char)iVar5 != '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"int","");
    return __return_storage_ptr__;
  }
  iVar5 = (*(type->super_t_type).super_t_doc._vptr_t_doc[0x10])(type);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(type->super_t_type).super_t_doc._vptr_t_doc[0xf])(type);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(type->super_t_type).super_t_doc._vptr_t_doc[0xe])(type);
      if ((char)iVar5 == '\0') {
        get_ttype_class_name_abi_cxx11_(__return_storage_ptr__,this,(t_type *)type);
        return __return_storage_ptr__;
      }
      type_name_abi_cxx11_
                (&local_a8,this,(t_type *)type[1].super_t_type.super_t_doc.doc_._M_dataplus._M_p);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x3aaca2);
      local_c8 = &local_b8;
      puVar9 = puVar7 + 2;
      if ((undefined8 *)*puVar7 == puVar9) {
        local_b8 = *puVar9;
        uStack_b0 = puVar7[3];
      }
      else {
        local_b8 = *puVar9;
        local_c8 = (undefined8 *)*puVar7;
      }
      local_c0 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    }
    else {
      type_name_abi_cxx11_
                (&local_a8,this,(t_type *)type[1].super_t_type.super_t_doc.doc_._M_dataplus._M_p);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x3aac9c);
      local_c8 = &local_b8;
      puVar9 = puVar7 + 2;
      if ((undefined8 *)*puVar7 == puVar9) {
        local_b8 = *puVar9;
        uStack_b0 = puVar7[3];
      }
      else {
        local_b8 = *puVar9;
        local_c8 = (undefined8 *)*puVar7;
      }
      local_c0 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar11) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    psVar4 = &local_a8;
    goto LAB_001b6722;
  }
  type_name_abi_cxx11_
            (&local_48,this,(t_type *)type[1].super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x3aac96);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_58 = *plVar8;
    lStack_50 = plVar6[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar8;
    local_68 = (long *)*plVar6;
  }
  local_60 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
  paVar1 = &local_a8.field_2;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_a8.field_2._M_allocated_capacity = *puVar10;
    local_a8.field_2._8_8_ = plVar6[3];
    local_a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *puVar10;
    local_a8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_a8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  type_name_abi_cxx11_
            (&local_88,this,(t_type *)type[1].super_t_type.super_t_doc.doc_._M_string_length);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    uVar12 = local_a8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_88._M_string_length + local_a8._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar12 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_88._M_string_length + local_a8._M_string_length) goto LAB_001b655d;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_88,0,(char *)0x0,(ulong)local_a8._M_dataplus._M_p);
  }
  else {
LAB_001b655d:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
  }
  local_c8 = &local_b8;
  puVar9 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar9) {
    local_b8 = *puVar9;
    uStack_b0 = puVar7[3];
  }
  else {
    local_b8 = *puVar9;
    local_c8 = (undefined8 *)*puVar7;
  }
  local_c0 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    lVar3 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  psVar4 = &local_48;
LAB_001b6722:
  puVar2 = (undefined1 *)(&(psVar4->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 != &psVar4->field_2) {
    operator_delete(puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::type_name(t_type* ttype) {
  ttype = get_true_type(ttype);

  if (ttype->is_base_type()) {
    return base_type_name((t_base_type*)ttype);
  } else if (ttype->is_enum()) {
    return "int";
  } else if (ttype->is_map()) {
    t_map* tmap = (t_map*)ttype;
    return "Map<" + type_name(tmap->get_key_type()) + ", "
                  + type_name(tmap->get_val_type()) + ">";
  } else if (ttype->is_set()) {
    t_set* tset = (t_set*)ttype;
    return "Set<" + type_name(tset->get_elem_type()) + ">";
  } else if (ttype->is_list()) {
    t_list* tlist = (t_list*)ttype;
    return "List<" + type_name(tlist->get_elem_type()) + ">";
  }

  return get_ttype_class_name(ttype);
}